

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O2

void __thiscall OpenMD::SimCreator::createMolecules(SimCreator *this,SimInfo *info)

{
  int iVar1;
  Molecule *mol;
  int i;
  long lVar2;
  MoleculeCreator molCreator;
  MoleculeCreator local_30;
  
  local_30._vptr_MoleculeCreator = (_func_int **)&PTR_createOverrideAtomTypes_002bc418;
  for (lVar2 = 0; lVar2 < info->nGlobalMols_; lVar2 = lVar2 + 1) {
    iVar1 = (info->molStampIds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar2];
    MoleculeCreator::createOverrideAtomTypes
              (&local_30,info->forceField_,
               (info->moleculeStamps_).
               super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar1]);
    mol = MoleculeCreator::createMolecule
                    (&local_30,info->forceField_,
                     (info->moleculeStamps_).
                     super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar1],(int)lVar2,
                     &info->localIndexMan_);
    SimInfo::addMolecule(info,mol);
  }
  return;
}

Assistant:

void SimCreator::createMolecules(SimInfo* info) {
    MoleculeCreator molCreator;
    int stampId;

    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
      stampId       = info->getMoleculeStampId(i);
      molCreator.createOverrideAtomTypes(info->getForceField(),
					 info->getMoleculeStamp(stampId));

#ifdef IS_MPI
      if (info->getMolToProc(i) == worldRank) {
#endif

        Molecule* mol = molCreator.createMolecule(
            info->getForceField(), info->getMoleculeStamp(stampId), i,
            info->getLocalIndexManager());

        info->addMolecule(mol);

#ifdef IS_MPI
      }
#endif
    }
  }